

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O3

void select_scan_parameters(j_compress_ptr cinfo)

{
  jpeg_scan_info *pjVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  undefined1 auVar4 [16];
  int iVar5;
  jpeg_component_info *pjVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  if (cinfo->scan_info == (jpeg_scan_info *)0x0) {
    uVar2 = cinfo->num_components;
    if (4 < (int)uVar2) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x1b;
      (pjVar3->msg_parm).i[0] = uVar2;
      (cinfo->err->msg_parm).i[1] = 4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      uVar2 = cinfo->num_components;
    }
    cinfo->comps_in_scan = uVar2;
    auVar4 = _DAT_00219ba0;
    if (0 < (int)uVar2) {
      pjVar6 = cinfo->comp_info;
      lVar7 = (ulong)uVar2 - 1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar8 = auVar8 ^ _DAT_00219ba0;
      auVar9 = _DAT_00219b90;
      do {
        auVar11 = auVar9 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                    auVar8._4_4_ < auVar11._4_4_) & 1)) {
          *(jpeg_component_info **)((long)cinfo->cur_comp_info + lVar7) = pjVar6;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          *(jpeg_component_info **)((long)cinfo->cur_comp_info + lVar7 + 8) = pjVar6 + 1;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x10;
        pjVar6 = pjVar6 + 2;
      } while ((ulong)(uVar2 + 1 >> 1) << 4 != lVar7);
    }
  }
  else {
    pjVar1 = cinfo->scan_info + *(int *)((long)&cinfo->master[1].pass_startup + 4);
    iVar5 = pjVar1->comps_in_scan;
    cinfo->comps_in_scan = iVar5;
    if (0 < (long)iVar5) {
      pjVar6 = cinfo->comp_info;
      lVar7 = 0;
      do {
        cinfo->cur_comp_info[lVar7] = pjVar6 + pjVar1->component_index[lVar7];
        lVar7 = lVar7 + 1;
      } while (iVar5 != lVar7);
    }
    if (cinfo->progressive_mode != 0) {
      iVar5 = pjVar1->Se;
      cinfo->Ss = pjVar1->Ss;
      cinfo->Se = iVar5;
      cinfo->Ah = pjVar1->Ah;
      iVar5 = pjVar1->Al;
      goto LAB_001dacae;
    }
  }
  iVar5 = 0;
  cinfo->Ss = 0;
  cinfo->Se = cinfo->block_size * cinfo->block_size + -1;
  cinfo->Ah = 0;
LAB_001dacae:
  cinfo->Al = iVar5;
  return;
}

Assistant:

LOCAL(void)
select_scan_parameters (j_compress_ptr cinfo)
/* Set up the scan parameters for the current scan */
{
  int ci;

#ifdef C_MULTISCAN_FILES_SUPPORTED
  if (cinfo->scan_info != NULL) {
    /* Prepare for current scan --- the script is already validated */
    my_master_ptr master = (my_master_ptr) cinfo->master;
    const jpeg_scan_info * scanptr = cinfo->scan_info + master->scan_number;

    cinfo->comps_in_scan = scanptr->comps_in_scan;
    for (ci = 0; ci < scanptr->comps_in_scan; ci++) {
      cinfo->cur_comp_info[ci] =
	&cinfo->comp_info[scanptr->component_index[ci]];
    }
    if (cinfo->progressive_mode) {
      cinfo->Ss = scanptr->Ss;
      cinfo->Se = scanptr->Se;
      cinfo->Ah = scanptr->Ah;
      cinfo->Al = scanptr->Al;
      return;
    }
  }
  else
#endif
  {
    /* Prepare for single sequential-JPEG scan containing all components */
    if (cinfo->num_components > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	       MAX_COMPS_IN_SCAN);
    cinfo->comps_in_scan = cinfo->num_components;
    for (ci = 0; ci < cinfo->num_components; ci++) {
      cinfo->cur_comp_info[ci] = &cinfo->comp_info[ci];
    }
  }
  cinfo->Ss = 0;
  cinfo->Se = cinfo->block_size * cinfo->block_size - 1;
  cinfo->Ah = 0;
  cinfo->Al = 0;
}